

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_cbc_mode.c
# Opt level: O3

int tc_cbc_mode_encrypt(uint8_t *out,uint outlen,uint8_t *in,uint inlen,uint8_t *iv,
                       TCAesKeySched_t sched)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  EVP_PKEY_CTX *dst;
  EVP_PKEY_CTX local_48 [8];
  uint8_t buffer [16];
  
  iVar1 = 0;
  iVar3 = 0;
  if ((((inlen + 0x10 == outlen) && (iVar3 = 0, ((inlen | outlen) & 0xf) == 0)) &&
      (iVar3 = iVar1, outlen != 0)) &&
     (((inlen != 0 && (out != (uint8_t *)0x0)) &&
      ((in != (uint8_t *)0x0 && (sched != (TCAesKeySched_t)0x0)))))) {
    buffer._8_8_ = sched;
    _copy(local_48,(EVP_PKEY_CTX *)0x10);
    _copy((EVP_PKEY_CTX *)out,(EVP_PKEY_CTX *)0x10);
    dst = (EVP_PKEY_CTX *)(out + 0x10);
    lVar5 = 0;
    uVar2 = 0;
    do {
      uVar4 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
      local_48[uVar4] = (EVP_PKEY_CTX)((byte)local_48[uVar4] ^ in[lVar5]);
      if (uVar2 == 0x10) {
        tc_aes_encrypt((uint8_t *)local_48,(uint8_t *)local_48,(TCAesKeySched_t)buffer._8_8_);
        _copy(dst,(EVP_PKEY_CTX *)0x10);
        dst = dst + 0x10;
        uVar2 = 0;
      }
      lVar5 = lVar5 + 1;
    } while (inlen != (uint)lVar5);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int tc_cbc_mode_encrypt(uint8_t *out, unsigned int outlen, const uint8_t *in,
			    unsigned int inlen, const uint8_t *iv,
			    const TCAesKeySched_t sched)
{

	uint8_t buffer[TC_AES_BLOCK_SIZE];
	unsigned int n, m;

	/* input sanity check: */
	if (out == (uint8_t *) 0 ||
	    in == (const uint8_t *) 0 ||
	    sched == (TCAesKeySched_t) 0 ||
	    inlen == 0 ||
	    outlen == 0 ||
	    (inlen % TC_AES_BLOCK_SIZE) != 0 ||
	    (outlen % TC_AES_BLOCK_SIZE) != 0 ||
	    outlen != inlen + TC_AES_BLOCK_SIZE) {
		return TC_CRYPTO_FAIL;
	}

	/* copy iv to the buffer */
	(void)_copy(buffer, TC_AES_BLOCK_SIZE, iv, TC_AES_BLOCK_SIZE);
	/* copy iv to the output buffer */
	(void)_copy(out, TC_AES_BLOCK_SIZE, iv, TC_AES_BLOCK_SIZE);
	out += TC_AES_BLOCK_SIZE;

	for (n = m = 0; n < inlen; ++n) {
		buffer[m++] ^= *in++;
		if (m == TC_AES_BLOCK_SIZE) {
			(void)tc_aes_encrypt(buffer, buffer, sched);
			(void)_copy(out, TC_AES_BLOCK_SIZE,
				    buffer, TC_AES_BLOCK_SIZE);
			out += TC_AES_BLOCK_SIZE;
			m = 0;
		}
	}

	return TC_CRYPTO_SUCCESS;
}